

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cpp
# Opt level: O2

bool fs_is_subdir(string_view subdir,string_view dir)

{
  __type _Var1;
  string d;
  string s;
  string local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (dir._M_len == 0 || subdir._M_len == 0) {
    _Var1 = false;
  }
  else {
    fs_drop_slash_abi_cxx11_(&local_50,subdir);
    fs_drop_slash_abi_cxx11_(&local_70,dir);
    _Var1 = std::operator==(&local_50,&local_70);
    if ((_Var1) || (local_50._M_string_length < local_70._M_string_length)) {
      _Var1 = false;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_30,(ulong)&local_50);
      _Var1 = std::operator==(&local_30,&local_70);
      std::__cxx11::string::~string((string *)&local_30);
    }
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return _Var1;
}

Assistant:

bool
fs_is_subdir(std::string_view subdir, std::string_view dir)
{
  // is subdir a subdirectory of dir. Does not normalize, canonicalize, or walk up the directory tree.
  // ".." is ambiguous and should be avoided in input

  if(subdir.empty() || dir.empty())
    return false;

  std::string const s = fs_drop_slash(subdir);
  std::string const d = fs_drop_slash(dir);

  if(s == d)
    return false;

  if(s.size() < d.size())
    return false;

#ifdef __cpp_lib_starts_ends_with  // C++20
  return s.starts_with(d);
#else
  return s.substr(0, d.size()) == d;
#endif

}